

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O0

value * __thiscall docopt::value::operator=(value *this,value *other)

{
  value *pvVar1;
  value local_40;
  value *local_18;
  value *other_local;
  value *this_local;
  
  local_18 = other;
  other_local = this;
  value(&local_40,other);
  pvVar1 = operator=(this,&local_40);
  ~value(&local_40);
  return pvVar1;
}

Assistant:

inline
	value& value::operator=(value const& other) {
		// make a copy and move from it; way easier.
		return *this = value{other};
	}